

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O0

_Bool Curl_uint_bset_first(uint_bset *bset,uint *pfirst)

{
  ulong uVar1;
  int iVar2;
  uint local_24;
  uint i;
  uint *pfirst_local;
  uint_bset *bset_local;
  
  local_24 = 0;
  while( true ) {
    if (bset->nslots <= local_24) {
      *pfirst = 0xffffffff;
      return false;
    }
    if (bset->slots[local_24] != 0) break;
    local_24 = local_24 + 1;
  }
  iVar2 = 0;
  for (uVar1 = bset->slots[local_24]; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
    iVar2 = iVar2 + 1;
  }
  *pfirst = local_24 * 0x40 + iVar2;
  return true;
}

Assistant:

bool Curl_uint_bset_first(struct uint_bset *bset, unsigned int *pfirst)
{
  unsigned int i;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i]) {
      *pfirst = (i * 64) + CURL_CTZ64(bset->slots[i]);
      return TRUE;
    }
  }
  *pfirst = UINT_MAX; /* a value we cannot store */
  return FALSE;
}